

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

Flow * __thiscall
wasm::Visitor<wasm::PrecomputingExpressionRunner,_wasm::Flow>::visit
          (Flow *__return_storage_ptr__,
          Visitor<wasm::PrecomputingExpressionRunner,_wasm::Flow> *this,Expression *curr)

{
  Expression *curr_local;
  Visitor<wasm::PrecomputingExpressionRunner,_wasm::Flow> *this_local;
  
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitBlock
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Block *)curr);
      break;
    case IfId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitIf
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(If *)curr);
      break;
    case LoopId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitLoop
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Loop *)curr);
      break;
    case BreakId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitBreak
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Break *)curr);
      break;
    case SwitchId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSwitch
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Switch *)curr);
      break;
    case CallId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitCall
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,(Call *)curr);
      break;
    case CallIndirectId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitCallIndirect
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (CallIndirect *)curr);
      break;
    case LocalGetId:
      PrecomputingExpressionRunner::visitLocalGet
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(LocalGet *)curr);
      break;
    case LocalSetId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitLocalSet
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (LocalSet *)curr);
      break;
    case GlobalGetId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitGlobalGet
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (GlobalGet *)curr);
      break;
    case GlobalSetId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitGlobalSet
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (GlobalSet *)curr);
      break;
    case LoadId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitLoad
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,(Load *)curr);
      break;
    case StoreId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStore
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,(Store *)curr)
      ;
      break;
    case ConstId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitConst
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Const *)curr);
      break;
    case UnaryId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitUnary
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Unary *)curr);
      break;
    case BinaryId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitBinary
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Binary *)curr);
      break;
    case SelectId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSelect
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Select *)curr);
      break;
    case DropId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitDrop
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Drop *)curr);
      break;
    case ReturnId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitReturn
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Return *)curr);
      break;
    case MemorySizeId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitMemorySize
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (MemorySize *)curr);
      break;
    case MemoryGrowId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitMemoryGrow
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (MemoryGrow *)curr);
      break;
    case NopId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitNop
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Nop *)curr);
      break;
    case UnreachableId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitUnreachable
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Unreachable *)curr);
      break;
    case AtomicRMWId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitAtomicRMW
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (AtomicRMW *)curr);
      break;
    case AtomicCmpxchgId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitAtomicCmpxchg
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (AtomicCmpxchg *)curr);
      break;
    case AtomicWaitId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitAtomicWait
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (AtomicWait *)curr);
      break;
    case AtomicNotifyId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitAtomicNotify
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (AtomicNotify *)curr);
      break;
    case AtomicFenceId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitAtomicFence
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(AtomicFence *)curr);
      break;
    case SIMDExtractId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDExtract
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(SIMDExtract *)curr);
      break;
    case SIMDReplaceId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDReplace
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(SIMDReplace *)curr);
      break;
    case SIMDShuffleId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDShuffle
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(SIMDShuffle *)curr);
      break;
    case SIMDTernaryId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDTernary
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(SIMDTernary *)curr);
      break;
    case SIMDShiftId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDShift
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(SIMDShift *)curr);
      break;
    case SIMDLoadId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDLoad
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (SIMDLoad *)curr);
      break;
    case SIMDLoadStoreLaneId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDLoadStoreLane
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (SIMDLoadStoreLane *)curr);
      break;
    case MemoryInitId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitMemoryInit
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (MemoryInit *)curr);
      break;
    case DataDropId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitDataDrop
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (DataDrop *)curr);
      break;
    case MemoryCopyId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitMemoryCopy
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (MemoryCopy *)curr);
      break;
    case MemoryFillId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitMemoryFill
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (MemoryFill *)curr);
      break;
    case PopId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitPop
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,(Pop *)curr);
      break;
    case RefNullId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefNull
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefNull *)curr);
      break;
    case RefIsNullId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefIsNull
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefIsNull *)curr);
      break;
    case RefFuncId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefFunc
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefFunc *)curr);
      break;
    case RefEqId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefEq
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefEq *)curr);
      break;
    case TableGetId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTableGet
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (TableGet *)curr);
      break;
    case TableSetId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTableSet
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (TableSet *)curr);
      break;
    case TableSizeId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTableSize
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (TableSize *)curr);
      break;
    case TableGrowId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTableGrow
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (TableGrow *)curr);
      break;
    case TableFillId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTableFill
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (TableFill *)curr);
      break;
    case TableCopyId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTableCopy
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (TableCopy *)curr);
      break;
    case TableInitId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTableInit
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (TableInit *)curr);
      break;
    case TryId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTry
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,(Try *)curr);
      break;
    case TryTableId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTryTable
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (TryTable *)curr);
      break;
    case ThrowId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitThrow
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(Throw *)curr);
      break;
    case RethrowId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRethrow
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (Rethrow *)curr);
      break;
    case ThrowRefId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitThrowRef
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(ThrowRef *)curr);
      break;
    case TupleMakeId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTupleMake
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(TupleMake *)curr);
      break;
    case TupleExtractId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitTupleExtract
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(TupleExtract *)curr);
      break;
    case RefI31Id:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefI31
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefI31 *)curr);
      break;
    case I31GetId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitI31Get
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(I31Get *)curr);
      break;
    case CallRefId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitCallRef
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (CallRef *)curr);
      break;
    case RefTestId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefTest
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefTest *)curr);
      break;
    case RefCastId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefCast
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(RefCast *)curr);
      break;
    case BrOnId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitBrOn
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(BrOn *)curr);
      break;
    case StructNewId:
      PrecomputingExpressionRunner::visitStructNew
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(StructNew *)curr);
      break;
    case StructGetId:
      PrecomputingExpressionRunner::visitStructGet
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(StructGet *)curr);
      break;
    case StructSetId:
      PrecomputingExpressionRunner::visitStructSet
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(StructSet *)curr);
      break;
    case StructRMWId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStructRMW
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StructRMW *)curr);
      break;
    case StructCmpxchgId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStructCmpxchg
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StructCmpxchg *)curr);
      break;
    case ArrayNewId:
      PrecomputingExpressionRunner::visitArrayNew
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(ArrayNew *)curr);
      break;
    case ArrayNewDataId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitArrayNewData
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (ArrayNewData *)curr);
      break;
    case ArrayNewElemId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitArrayNewElem
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (ArrayNewElem *)curr);
      break;
    case ArrayNewFixedId:
      PrecomputingExpressionRunner::visitArrayNewFixed
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      PrecomputingExpressionRunner::visitArrayGet
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(ArrayGet *)curr);
      break;
    case ArraySetId:
      PrecomputingExpressionRunner::visitArraySet
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(ArraySet *)curr);
      break;
    case ArrayLenId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitArrayLen
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(ArrayLen *)curr);
      break;
    case ArrayCopyId:
      PrecomputingExpressionRunner::visitArrayCopy
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(ArrayCopy *)curr);
      break;
    case ArrayFillId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitArrayFill
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (ArrayFill *)curr);
      break;
    case ArrayInitDataId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitArrayInitData
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (ArrayInitData *)curr);
      break;
    case ArrayInitElemId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitArrayInitElem
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (ArrayInitElem *)curr);
      break;
    case RefAsId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefAs
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,(RefAs *)curr)
      ;
      break;
    case StringNewId:
      PrecomputingExpressionRunner::visitStringNew
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(StringNew *)curr);
      break;
    case StringConstId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringConst
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StringConst *)curr);
      break;
    case StringMeasureId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringMeasure
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StringMeasure *)curr);
      break;
    case StringEncodeId:
      PrecomputingExpressionRunner::visitStringEncode
                (__return_storage_ptr__,(PrecomputingExpressionRunner *)this,(StringEncode *)curr);
      break;
    case StringConcatId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringConcat
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StringConcat *)curr);
      break;
    case StringEqId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringEq
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StringEq *)curr);
      break;
    case StringWTF16GetId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringWTF16Get
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StringWTF16Get *)curr);
      break;
    case StringSliceWTFId:
      ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStringSliceWTF
                (__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)this
                 ,(StringSliceWTF *)curr);
      break;
    case ContNewId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitContNew
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (ContNew *)curr);
      break;
    case ContBindId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitContBind
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (ContBind *)curr);
      break;
    case SuspendId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSuspend
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (Suspend *)curr);
      break;
    case ResumeId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitResume
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,(Resume *)curr
                );
      break;
    case ResumeThrowId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitResumeThrow
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (ResumeThrow *)curr);
      break;
    case StackSwitchId:
      ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStackSwitch
                (__return_storage_ptr__,
                 (ConstantExpressionRunner<wasm::PrecomputingExpressionRunner> *)this,
                 (StackSwitch *)curr);
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::PrecomputingExpressionRunner, wasm::Flow>::visit(Expression *) [SubType = wasm::PrecomputingExpressionRunner, ReturnType = wasm::Flow]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }